

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.hh
# Opt level: O0

void __thiscall QPDFJob::UnderOverlay::UnderOverlay(UnderOverlay *this,UnderOverlay *param_1)

{
  UnderOverlay *param_1_local;
  UnderOverlay *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  std::__cxx11::string::string((string *)&this->filename,(string *)&param_1->filename);
  std::shared_ptr<char>::shared_ptr(&this->password,&param_1->password);
  std::__cxx11::string::string((string *)&this->to_nr,(string *)&param_1->to_nr);
  std::__cxx11::string::string((string *)&this->from_nr,(string *)&param_1->from_nr);
  std::__cxx11::string::string((string *)&this->repeat_nr,(string *)&param_1->repeat_nr);
  std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::unique_ptr(&this->pdf,&param_1->pdf);
  std::vector<int,_std::allocator<int>_>::vector(&this->to_pagenos,&param_1->to_pagenos);
  std::vector<int,_std::allocator<int>_>::vector(&this->from_pagenos,&param_1->from_pagenos);
  std::vector<int,_std::allocator<int>_>::vector(&this->repeat_pagenos,&param_1->repeat_pagenos);
  return;
}

Assistant:

UnderOverlay(char const* which) :
            which(which),
            to_nr("1-z"),
            from_nr("1-z"),
            repeat_nr("")
        {
        }